

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

secp256k1_scratch_space * secp256k1_scratch_space_create(secp256k1_context *ctx,size_t max_size)

{
  secp256k1_scratch_space *psVar1;
  
  psVar1 = (secp256k1_scratch_space *)checked_malloc(&ctx->error_callback,max_size + 0x20);
  if (psVar1 != (secp256k1_scratch_space *)0x0) {
    psVar1->alloc_size = 0;
    builtin_memcpy(psVar1->magic,"scratch",8);
    psVar1->data = psVar1 + 1;
    psVar1->max_size = max_size;
  }
  return psVar1;
}

Assistant:

secp256k1_scratch_space* secp256k1_scratch_space_create(const secp256k1_context* ctx, size_t max_size) {
    VERIFY_CHECK(ctx != NULL);
    return secp256k1_scratch_create(&ctx->error_callback, max_size);
}